

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactor_impl.h
# Opt level: O3

void __thiscall
iqnet::Reactor<iqnet::Null_lock>::invoke_event_handler
          (Reactor<iqnet::Null_lock> *this,HandlerState *hs)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  _Base_ptr p_Var3;
  long lVar4;
  _Base_ptr p_Var5;
  bool terminate;
  bool local_19;
  
  local_19 = false;
  p_Var5 = (this->handlers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var5 != (_Base_ptr)0x0) {
    iVar2 = hs->fd;
    p_Var1 = &(this->handlers)._M_t._M_impl.super__Rb_tree_header;
    p_Var3 = &p_Var1->_M_header;
    do {
      if (iVar2 <= (int)p_Var5[1]._M_color) {
        p_Var3 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < iVar2];
    } while (p_Var5 != (_Base_ptr)0x0);
    if ((((_Rb_tree_header *)p_Var3 != p_Var1) && ((int)p_Var3[1]._M_color <= iVar2)) &&
       (p_Var5 = p_Var3[1]._M_parent, p_Var5 != (_Base_ptr)0x0)) {
      iVar2 = (*(*(_func_int ***)p_Var5)[6])(p_Var5);
      if ((char)iVar2 == '\0') {
        lVar4 = 0x18;
        if (((hs->revents & 1U) != 0) || (lVar4 = 0x20, (hs->revents & 2U) != 0)) {
          (**(code **)((long)*(_func_int ***)p_Var5 + lVar4))(p_Var5,&local_19);
        }
      }
      else {
        invoke_servers_handler(this,(Event_handler *)p_Var5,hs,&local_19);
      }
      if (local_19 == true) {
        (*(this->super_Reactor_base)._vptr_Reactor_base[4])(this,p_Var5);
        (*(*(_func_int ***)p_Var5)[5])(p_Var5);
      }
      return;
    }
  }
  __assert_fail("handler",
                "/workspace/llm4binary/github/license_c_cmakelists/adedov[P]libiqxmlrpc/libiqxmlrpc/reactor_impl.h"
                ,0xd5,
                "void iqnet::Reactor<iqnet::Null_lock>::invoke_event_handler(Reactor_base::HandlerState &) [Lock = iqnet::Null_lock]"
               );
}

Assistant:

void Reactor<Lock>::invoke_event_handler( Reactor_base::HandlerState& hs )
{
  bool terminate = false;

  Event_handler* handler = find_handler(hs.fd);
  assert(handler);

  if( handler->catch_in_reactor() )
    invoke_servers_handler( handler, hs, terminate );
  else
    invoke_clients_handler( handler, hs, terminate );

  if( terminate )
  {
    unregister_handler( handler );
    handler->finish();
  }
}